

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

bool __thiscall QNetmask::setAddress(QNetmask *this,QHostAddress *address)

{
  char cVar1;
  uint uVar2;
  QHostAddressPrivate *pQVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  char *__n;
  quint8 qVar7;
  long *plVar8;
  long in_FS_OFFSET;
  undefined1 local_28 [8];
  undefined1 *puStack_20;
  long local_18;
  
  plVar8 = (long *)local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this->length = 0xff;
  pQVar3 = (address->d).d.ptr;
  if (pQVar3->protocol == '\x01') {
    plVar6 = &local_18;
    local_28 = (undefined1  [8])(pQVar3->field_1).a6_64.c[0];
    puStack_20 = (undefined1 *)(pQVar3->field_1).a6_64.c[1];
  }
  else {
    if (pQVar3->protocol != '\0') {
switchD_001a00b8_caseD_f9:
      bVar4 = false;
      goto LAB_001a011e;
    }
    plVar6 = (long *)(local_28 + 4);
    uVar2 = pQVar3->a;
    local_28._4_4_ = 0xaaaaaaaa;
    local_28._0_4_ = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
    ;
  }
  __n = (char *)((long)plVar6 + ~(ulong)local_28);
  qVar7 = '\0';
LAB_001a009c:
  if (plVar8 < plVar6) {
    cVar1 = (char)*plVar8;
    switch(cVar1) {
    case -8:
      goto switchD_001a00b8_caseD_f8;
    case -7:
    case -6:
    case -5:
    case -3:
      goto switchD_001a00b8_caseD_f9;
    case -4:
      goto switchD_001a00b8_caseD_fc;
    case -2:
      goto switchD_001a00b8_caseD_fe;
    case -1:
      goto switchD_001a00b8_caseD_ff;
    default:
      if (cVar1 == '\0') goto LAB_001a0102;
      if (cVar1 == -0x80) goto LAB_001a00ff;
      if (cVar1 == -0x40) goto LAB_001a00fc;
      if (cVar1 == -0x20) goto LAB_001a00f9;
      if (cVar1 == -0x10) goto LAB_001a00f6;
      goto switchD_001a00b8_caseD_f9;
    }
  }
LAB_001a0119:
  this->length = qVar7;
  bVar4 = true;
LAB_001a011e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar4;
switchD_001a00b8_caseD_ff:
  qVar7 = qVar7 + '\b';
  plVar8 = (long *)((long)plVar8 + 1);
  __n = __n + -1;
  goto LAB_001a009c;
switchD_001a00b8_caseD_fe:
  qVar7 = qVar7 + '\x01';
switchD_001a00b8_caseD_fc:
  qVar7 = qVar7 + '\x01';
switchD_001a00b8_caseD_f8:
  qVar7 = qVar7 + '\x01';
LAB_001a00f6:
  qVar7 = qVar7 + '\x01';
LAB_001a00f9:
  qVar7 = qVar7 + '\x01';
LAB_001a00fc:
  qVar7 = qVar7 + '\x01';
LAB_001a00ff:
  qVar7 = qVar7 + '\x01';
LAB_001a0102:
  iVar5 = bcmp((char *)((long)plVar8 + 1),"",(size_t)__n);
  if (iVar5 != 0) goto switchD_001a00b8_caseD_f9;
  goto LAB_001a0119;
}

Assistant:

bool QNetmask::setAddress(const QHostAddress &address)
{
    static const quint8 zeroes[16] = { 0 };
    union {
        quint32 v4;
        quint8 v6[16];
    } ip;

    int netmask = 0;
    quint8 *ptr = ip.v6;
    quint8 *end;
    length = 255;

    if (address.protocol() == QHostAddress::IPv4Protocol) {
        ip.v4 = qToBigEndian(address.toIPv4Address());
        end = ptr + 4;
    } else if (address.protocol() == QHostAddress::IPv6Protocol) {
        memcpy(ip.v6, address.toIPv6Address().c, 16);
        end = ptr + 16;
    } else {
        return false;
    }

    while (ptr < end) {
        switch (*ptr) {
        case 255:
            netmask += 8;
            ++ptr;
            continue;

        default:
            return false;       // invalid IP-style netmask

        case 254:
            ++netmask;
            Q_FALLTHROUGH();
        case 252:
            ++netmask;
            Q_FALLTHROUGH();
        case 248:
            ++netmask;
            Q_FALLTHROUGH();
        case 240:
            ++netmask;
            Q_FALLTHROUGH();
        case 224:
            ++netmask;
            Q_FALLTHROUGH();
        case 192:
            ++netmask;
            Q_FALLTHROUGH();
        case 128:
            ++netmask;
            Q_FALLTHROUGH();
        case 0:
            break;
        }
        break;
    }

    // confirm that the rest is only zeroes
    if (ptr < end && memcmp(ptr + 1, zeroes, end - ptr - 1) != 0)
        return false;

    length = netmask;
    return true;
}